

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall
QTableWidgetPrivate::emitCurrentItemChanged
          (QTableWidgetPrivate *this,QModelIndex *current,QModelIndex *previous)

{
  QObject *pQVar1;
  QTableModel *pQVar2;
  QTableWidgetItem *pQVar3;
  QTableWidgetItem *pQVar4;
  long in_FS_OFFSET;
  QTableWidgetItem *local_80;
  QTableWidgetItem *local_78;
  int local_70;
  int local_6c;
  void *local_68;
  QTableWidgetItem **local_60;
  QTableWidgetItem **local_58;
  int *local_50;
  int *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)
            &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
             super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar2 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  pQVar3 = QTableModel::item(pQVar2,current);
  pQVar2 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  pQVar4 = QTableModel::item(pQVar2,previous);
  if (pQVar3 != (QTableWidgetItem *)0x0 || pQVar4 != (QTableWidgetItem *)0x0) {
    local_58 = &local_80;
    local_68 = (void *)0x0;
    local_80 = pQVar4;
    local_78 = pQVar3;
    local_60 = &local_78;
    QMetaObject::activate(pQVar1,&QTableWidget::staticMetaObject,6,&local_68);
  }
  local_6c = previous->r;
  local_70 = previous->c;
  local_78 = (QTableWidgetItem *)CONCAT44(local_78._4_4_,current->r);
  local_58 = &local_80;
  local_80 = (QTableWidgetItem *)CONCAT44(local_80._4_4_,current->c);
  local_50 = &local_6c;
  local_48 = &local_70;
  local_68 = (void *)0x0;
  local_60 = &local_78;
  QMetaObject::activate(pQVar1,&QTableWidget::staticMetaObject,0xe,&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetPrivate::emitCurrentItemChanged(const QModelIndex &current,
                                                 const QModelIndex &previous)
{
    Q_Q(QTableWidget);
    QTableWidgetItem *currentItem = tableModel()->item(current);
    QTableWidgetItem *previousItem = tableModel()->item(previous);
    if (currentItem || previousItem)
        emit q->currentItemChanged(currentItem, previousItem);
    emit q->currentCellChanged(current.row(), current.column(), previous.row(), previous.column());
}